

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall Message::EnqueueMessage(Message *this,char *msg)

{
  int iVar1;
  char (*pacVar2) [20];
  size_t __n;
  
  sem_wait((sem_t *)&this->_full);
  sem_wait((sem_t *)this);
  iVar1 = this->_current;
  this->_current = iVar1 + 1;
  pacVar2 = this->_messages + (long)iVar1 + 1;
  *(char *)((long)pacVar2 + 0x10) = '\0';
  *(char *)((long)pacVar2 + 0x11) = '\0';
  *(char *)((long)pacVar2 + 0x12) = '\0';
  *(char *)((long)pacVar2 + 0x13) = '\0';
  pacVar2 = this->_messages + (long)iVar1 + 1;
  *(char *)((long)pacVar2 + 0) = '\0';
  *(char *)((long)pacVar2 + 1) = '\0';
  *(char *)((long)pacVar2 + 2) = '\0';
  *(char *)((long)pacVar2 + 3) = '\0';
  *(char *)((long)pacVar2 + 4) = '\0';
  *(char *)((long)pacVar2 + 5) = '\0';
  *(char *)((long)pacVar2 + 6) = '\0';
  *(char *)((long)pacVar2 + 7) = '\0';
  *(char *)((long)pacVar2 + 8) = '\0';
  *(char *)((long)pacVar2 + 9) = '\0';
  *(char *)((long)pacVar2 + 10) = '\0';
  *(char *)((long)pacVar2 + 0xb) = '\0';
  *(char *)((long)pacVar2 + 0xc) = '\0';
  *(char *)((long)pacVar2 + 0xd) = '\0';
  *(char *)((long)pacVar2 + 0xe) = '\0';
  *(char *)((long)pacVar2 + 0xf) = '\0';
  iVar1 = this->_current;
  __n = strlen(msg);
  memcpy(this->_messages + iVar1,msg,__n);
  sem_post((sem_t *)this);
  sem_post((sem_t *)&this->_empty);
  return;
}

Assistant:

void Message::EnqueueMessage(const char *msg)
{
    sem_wait(&_full);
    sem_wait(&_lock);
    _current += 1;
    bzero(&_messages[_current], MaxMessageSize*sizeof(char));
    memcpy(&_messages[_current], msg, strlen(msg)*sizeof(char));
    sem_post(&_lock);
    sem_post(&_empty);
}